

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put_raw(buffer *this,byte *ba,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *__dest;
  ulong in_RDX;
  void *in_RSI;
  buffer *in_RDI;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < in_RDX) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store a raw byte array");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  __dest = data(in_RDI);
  memcpy(__dest,in_RSI,in_RDX);
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)in_RDX;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)in_RDX;
  }
  return;
}

Assistant:

void buffer::put_raw(const byte* ba, size_t len) {
    if ( size() - pos() < len) {
        throw std::overflow_error
              ( "insufficient buffer to store a raw byte array" );
    }

    ::memcpy(data(), ba, len);
    __mv_fw_block(this, len);
}